

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# work_thread.hpp
# Opt level: O1

demand_unique_ptr_t __thiscall
so_5::disp::prio_one_thread::reuse::
work_thread_template_t<so_5::disp::prio_one_thread::strictly_ordered::impl::demand_queue_t,_so_5::disp::prio_one_thread::reuse::work_thread_details::with_activity_tracking_impl_t>
::pop_demand(work_thread_template_t<so_5::disp::prio_one_thread::strictly_ordered::impl::demand_queue_t,_so_5::disp::prio_one_thread::reuse::work_thread_details::with_activity_tracking_impl_t>
             *this)

{
  long in_RSI;
  
  stats::activity_tracking_stuff::
  stats_collector_t<so_5::stats::activity_tracking_stuff::internal_lock>::start
            ((stats_collector_t<so_5::stats::activity_tracking_stuff::internal_lock> *)
             (in_RSI + 0x40));
  strictly_ordered::impl::demand_queue_t::pop((demand_queue_t *)this);
  stats::activity_tracking_stuff::
  stats_collector_t<so_5::stats::activity_tracking_stuff::internal_lock>::stop
            ((stats_collector_t<so_5::stats::activity_tracking_stuff::internal_lock> *)
             (in_RSI + 0x40));
  return (__uniq_ptr_data<so_5::disp::prio_one_thread::strictly_ordered::impl::demand_t,_std::default_delete<so_5::disp::prio_one_thread::strictly_ordered::impl::demand_t>,_true,_true>
          )(__uniq_ptr_data<so_5::disp::prio_one_thread::strictly_ordered::impl::demand_t,_std::default_delete<so_5::disp::prio_one_thread::strictly_ordered::impl::demand_t>,_true,_true>
            )this;
}

Assistant:

auto
		pop_demand() -> decltype(std::declval<DEMAND_QUEUE>().pop())
			{
				this->wait_started();
				auto wait_meter_stopper = so_5::details::at_scope_exit(
						[this] { this->wait_finished(); } );

				return this->m_queue.pop();
			}